

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O1

void __thiscall
TPZSFMatrix<long_double>::TPZSFMatrix(TPZSFMatrix<long_double> *this,TPZMatrix<long_double> *A)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int64_t iVar3;
  char cVar4;
  longdouble lVar5;
  longdouble lVar6;
  longdouble lVar7;
  longdouble lVar8;
  longdouble lVar9;
  longdouble lVar10;
  int iVar11;
  undefined4 extraout_var;
  ulong uVar12;
  longdouble *plVar13;
  int extraout_var_00;
  undefined4 extraout_var_01;
  long lVar14;
  long lVar15;
  int64_t c;
  long lVar16;
  longdouble in_ST0;
  longdouble lVar17;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZBaseMatrix_01891cf0;
  uVar1 = *(undefined4 *)((long)&(A->super_TPZBaseMatrix).fRow + 4);
  iVar3 = (A->super_TPZBaseMatrix).fCol;
  uVar2 = *(undefined4 *)((long)&(A->super_TPZBaseMatrix).fCol + 4);
  *(int *)&(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow =
       (int)(A->super_TPZBaseMatrix).fRow;
  *(undefined4 *)((long)&(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow + 4) = uVar1;
  *(int *)&(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol = (int)iVar3;
  *(undefined4 *)((long)&(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol + 4) = uVar2;
  cVar4 = (A->super_TPZBaseMatrix).fDefPositive;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed =
       (A->super_TPZBaseMatrix).fDecomposed;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDefPositive = cVar4;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZSFMatrix_01890760;
  lVar14 = (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
  if (lVar14 != (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Cannot call TPZBaseMatrix::Dim() for a non-square ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"matrix! Aborting...",0x13);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzbasematrix.h"
               ,0x4f);
  }
  iVar11 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
             _vptr_TPZSavable[0xc])();
  uVar12 = (CONCAT44(extraout_var,iVar11) + 1) * lVar14 >> 1;
  plVar13 = (longdouble *)operator_new__(-(ulong)(uVar12 >> 0x3c != 0) | uVar12 << 4);
  this->fElem = plVar13;
  iVar11 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
             _vptr_TPZSavable[0xc])(this);
  if (CONCAT44(extraout_var_00,iVar11) != 0 && -1 < extraout_var_00) {
    lVar14 = 1;
    lVar15 = 0;
    do {
      lVar16 = 0;
      lVar17 = in_ST0;
      lVar5 = in_ST1;
      lVar6 = in_ST2;
      lVar7 = in_ST3;
      lVar8 = in_ST4;
      lVar9 = in_ST5;
      lVar10 = in_ST6;
      in_ST6 = in_ST7;
      do {
        in_ST5 = lVar10;
        in_ST4 = lVar9;
        in_ST3 = lVar8;
        in_ST2 = lVar7;
        in_ST1 = lVar6;
        in_ST0 = lVar5;
        (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(A,lVar15,lVar16);
        *plVar13 = lVar17;
        plVar13 = plVar13 + 1;
        lVar16 = lVar16 + 1;
        lVar17 = in_ST0;
        lVar5 = in_ST1;
        lVar6 = in_ST2;
        lVar7 = in_ST3;
        lVar8 = in_ST4;
        lVar9 = in_ST5;
        lVar10 = in_ST6;
      } while (lVar14 != lVar16);
      lVar15 = lVar15 + 1;
      in_ST7 = in_ST6;
      iVar11 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
                 _vptr_TPZSavable[0xc])(this);
      lVar14 = lVar14 + 1;
    } while (lVar15 < CONCAT44(extraout_var_01,iVar11));
  }
  return;
}

Assistant:

TPZSFMatrix<TVar> ::TPZSFMatrix(const  TPZMatrix<TVar>  &A )
: TPZRegisterClassId(&TPZSFMatrix::ClassId),
TPZMatrix<TVar> ( A )
{
    int64_t size = Size();
	fElem = new TVar[size] ;
	
	if ( fElem == NULL )
		TPZMatrix<TVar> ::Error(__PRETTY_FUNCTION__, "Constructor <memory allocation error>." );
	
	// Copia a matriz
	TVar *dst = fElem;
	for ( int64_t r = 0; r < this->Dim(); r++ )
		for ( int64_t c = 0; c <= r; c++ )
			*dst++ = A.GetVal( r, c );
}